

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMap.c
# Opt level: O3

If_Man_t * Nwk_ManToIf(Aig_Man_t *p,If_Par_t *pPars,Vec_Ptr_t *vAigToIf)

{
  void *pvVar1;
  Aig_Obj_t **ppAVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  If_Man_t *p_00;
  Vec_Ptr_t *pVVar7;
  If_Obj_t *pIVar8;
  Aig_Obj_t *pAVar9;
  long lVar10;
  long lVar11;
  void *pvVar12;
  int iVar13;
  Aig_Man_t *pAVar14;
  timespec ts;
  Vec_Int_t *local_58;
  int *local_50;
  int *local_48;
  timespec local_40;
  
  iVar4 = clock_gettime(3,&local_40);
  if (iVar4 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  Aig_ManSetRegNum(p,0);
  if (pPars->fPower == 0) {
    local_50 = (int *)0x0;
    local_48 = (int *)0x0;
    pVVar6 = (Vec_Int_t *)0x0;
    local_58 = (Vec_Int_t *)0x0;
  }
  else {
    pAVar14 = p;
    local_58 = Saig_ManComputeSwitchProbs(p,0x30,0x10,0);
    if (pPars->fVerbose != 0) {
      Abc_Print((int)pAVar14,"%s =","Computing switching activity");
      iVar13 = 3;
      iVar4 = clock_gettime(3,&local_40);
      if (iVar4 < 0) {
        lVar11 = -1;
      }
      else {
        lVar11 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      Abc_Print(iVar13,"%9.2f sec\n",(double)(lVar11 + lVar10) / 1000000.0);
    }
    local_48 = local_58->pArray;
    iVar4 = p->vObjs->nSize;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    iVar13 = 0x10;
    if (0xe < iVar4 - 1U) {
      iVar13 = iVar4;
    }
    pVVar6->nCap = iVar13;
    if (iVar13 == 0) {
      local_50 = (int *)0x0;
    }
    else {
      local_50 = (int *)malloc((long)iVar13 << 2);
    }
    pVVar6->pArray = local_50;
    pVVar6->nSize = iVar4;
    memset(local_50,0,(long)iVar4 << 2);
  }
  p_00 = If_ManStart(pPars);
  p_00->vSwitching = pVVar6;
  pVVar7 = p->vObjs;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    do {
      pvVar1 = pVVar7->pArray[lVar10];
      if (pvVar1 != (void *)0x0) {
        uVar5 = (uint)*(undefined8 *)((long)pvVar1 + 0x18) & 7;
        if (uVar5 == 2) {
          pIVar8 = If_ManCreateCi(p_00);
          if (((ulong)pvVar1 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                          ,0x143,"int Aig_ObjLevel(Aig_Obj_t *)");
          }
          uVar5 = (uint)(*(ulong *)((long)pvVar1 + 0x18) >> 0x13);
          *(uint *)pIVar8 = *(uint *)pIVar8 & 0x1fff | uVar5 & 0xffffe000;
          uVar5 = uVar5 >> 0xd;
          if (p_00->nLevelMax < (int)uVar5) {
            p_00->nLevelMax = uVar5;
          }
        }
        else if (uVar5 == 3) {
          pIVar8 = If_ManCreateCo(p_00,(If_Obj_t *)
                                       ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^
                                       *(ulong *)((*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe
                                                  ) + 0x28)));
        }
        else if (uVar5 == 5) {
          pIVar8 = If_ManCreateAnd(p_00,(If_Obj_t *)
                                        ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^
                                        *(ulong *)((*(ulong *)((long)pvVar1 + 8) &
                                                   0xfffffffffffffffe) + 0x28)),
                                   (If_Obj_t *)
                                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^
                                   *(ulong *)((*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe)
                                             + 0x28)));
        }
        else {
          if (((ulong)pvVar1 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                          ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
          }
          if (uVar5 != 1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMap.c"
                          ,0x9b,"If_Man_t *Nwk_ManToIf(Aig_Man_t *, If_Par_t *, Vec_Ptr_t *)");
          }
          pIVar8 = p_00->pConst1;
        }
        if (vAigToIf->nSize <= lVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (vAigToIf->pArray[lVar10] != (void *)0x0) {
          __assert_fail("Vec_PtrEntry(vAigToIf, i) == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMap.c"
                        ,0x9d,"If_Man_t *Nwk_ManToIf(Aig_Man_t *, If_Par_t *, Vec_Ptr_t *)");
        }
        vAigToIf->pArray[lVar10] = pIVar8;
        *(If_Obj_t **)((long)pvVar1 + 0x28) = pIVar8;
        if (pVVar6 != (Vec_Int_t *)0x0) {
          local_50[pIVar8->Id] = local_48[*(int *)((long)pvVar1 + 0x24)];
        }
        ppAVar2 = p->pEquivs;
        if (((ppAVar2 != (Aig_Obj_t **)0x0) &&
            (pAVar9 = ppAVar2[*(int *)((long)pvVar1 + 0x24)], pAVar9 != (Aig_Obj_t *)0x0)) &&
           ((*(uint *)((long)pvVar1 + 0x18) & 0xffffffc0) != 0)) {
          pvVar12 = *(void **)((long)pvVar1 + 0x28);
          do {
            pvVar3 = (pAVar9->field_5).pData;
            *(void **)((long)pvVar12 + 0x28) = pvVar3;
            pAVar9 = ppAVar2[pAVar9->Id];
            pvVar12 = pvVar3;
          } while (pAVar9 != (Aig_Obj_t *)0x0);
          If_ManCreateChoice(p_00,*(If_Obj_t **)((long)pvVar1 + 0x28));
        }
      }
      lVar10 = lVar10 + 1;
      pVVar7 = p->vObjs;
    } while (lVar10 < pVVar7->nSize);
  }
  if (local_58 != (Vec_Int_t *)0x0) {
    if (local_58->pArray != (int *)0x0) {
      free(local_58->pArray);
    }
    free(local_58);
  }
  return p_00;
}

Assistant:

If_Man_t * Nwk_ManToIf( Aig_Man_t * p, If_Par_t * pPars, Vec_Ptr_t * vAigToIf )
{
    extern Vec_Int_t * Saig_ManComputeSwitchProbs( Aig_Man_t * p, int nFrames, int nPref, int fProbOne );
    Vec_Int_t * vSwitching = NULL, * vSwitching2 = NULL;
    float * pSwitching = NULL, * pSwitching2 = NULL;
    If_Man_t * pIfMan;
    If_Obj_t * pIfObj;
    Aig_Obj_t * pNode, * pFanin, * pPrev;
    int i;
    abctime clk = Abc_Clock();
    // set the number of registers (switch activity will be combinational)
    Aig_ManSetRegNum( p, 0 );
    if ( pPars->fPower )
    {
        vSwitching  = Saig_ManComputeSwitchProbs( p, 48, 16, 0 );
        if ( pPars->fVerbose )
        {
            ABC_PRT( "Computing switching activity", Abc_Clock() - clk );
        }
        pSwitching  = (float *)vSwitching->pArray;
        vSwitching2 = Vec_IntStart( Aig_ManObjNumMax(p) );
        pSwitching2 = (float *)vSwitching2->pArray;
    }
    // start the mapping manager and set its parameters
    pIfMan = If_ManStart( pPars );
    pIfMan->vSwitching = vSwitching2;
    // load the AIG into the mapper
    Aig_ManForEachObj( p, pNode, i )
    {
        if ( Aig_ObjIsAnd(pNode) )
        {
            pIfObj = If_ManCreateAnd( pIfMan, 
                If_NotCond( (If_Obj_t *)Aig_ObjFanin0(pNode)->pData, Aig_ObjFaninC0(pNode) ), 
                If_NotCond( (If_Obj_t *)Aig_ObjFanin1(pNode)->pData, Aig_ObjFaninC1(pNode) ) );
//            printf( "no%d=%d\n ", If_ObjId(pIfObj), If_ObjLevel(pIfObj) );
        }
        else if ( Aig_ObjIsCi(pNode) )
        {
            pIfObj = If_ManCreateCi( pIfMan );
            If_ObjSetLevel( pIfObj, Aig_ObjLevel(pNode) );
//            printf( "pi%d=%d\n ", If_ObjId(pIfObj), If_ObjLevel(pIfObj) );
            if ( pIfMan->nLevelMax < (int)pIfObj->Level )
                pIfMan->nLevelMax = (int)pIfObj->Level;
        }
        else if ( Aig_ObjIsCo(pNode) )
        {
            pIfObj = If_ManCreateCo( pIfMan, If_NotCond( (If_Obj_t *)Aig_ObjFanin0(pNode)->pData, Aig_ObjFaninC0(pNode) ) );
//            printf( "po%d=%d\n ", If_ObjId(pIfObj), If_ObjLevel(pIfObj) );
        }
        else if ( Aig_ObjIsConst1(pNode) )
            pIfObj = If_ManConst1( pIfMan );
        else // add the node to the mapper
            assert( 0 );
        // save the result
        assert( Vec_PtrEntry(vAigToIf, i) == NULL );
        Vec_PtrWriteEntry( vAigToIf, i, pIfObj );
        pNode->pData = pIfObj;
        if ( vSwitching2 )
            pSwitching2[pIfObj->Id] = pSwitching[pNode->Id];            
        // set up the choice node
        if ( Aig_ObjIsChoice( p, pNode ) )
        {
            for ( pPrev = pNode, pFanin = Aig_ObjEquiv(p, pNode); pFanin; pPrev = pFanin, pFanin = Aig_ObjEquiv(p, pFanin) )
                If_ObjSetChoice( (If_Obj_t *)pPrev->pData, (If_Obj_t *)pFanin->pData );
            If_ManCreateChoice( pIfMan, (If_Obj_t *)pNode->pData );
        }
//        assert( If_ObjLevel(pIfObj) == Aig_ObjLevel(pNode) );
    }
    if ( vSwitching )
        Vec_IntFree( vSwitching );
    return pIfMan;
}